

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadrilateral.cpp
# Opt level: O3

void pztopology::TPZQuadrilateral::ParametricDomainNodeCoord(int node,TPZVec<double> *nodeCoord)

{
  double *pdVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  
  if (node < 5) {
    (*nodeCoord->_vptr_TPZVec[2])(nodeCoord,2);
    switch(node) {
    case 0:
      pdVar1 = nodeCoord->fStore;
      uVar2 = 0xbff00000;
      uVar3 = 0xbff00000;
      break;
    case 1:
      pdVar1 = nodeCoord->fStore;
      uVar2 = 0x3ff00000;
      uVar3 = 0xbff00000;
      break;
    case 2:
      pdVar1 = nodeCoord->fStore;
      uVar2 = 0x3ff00000;
      uVar3 = 0x3ff00000;
      break;
    case 3:
      pdVar1 = nodeCoord->fStore;
      uVar2 = 0xbff00000;
      uVar3 = 0x3ff00000;
      break;
    default:
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzquadrilateral.cpp"
                 ,0x19b);
    }
    *(undefined4 *)pdVar1 = 0;
    *(undefined4 *)((long)pdVar1 + 4) = uVar2;
    *(undefined4 *)(pdVar1 + 1) = 0;
    *(undefined4 *)((long)pdVar1 + 0xc) = uVar3;
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzquadrilateral.cpp"
             ,0x17d);
}

Assistant:

void TPZQuadrilateral::ParametricDomainNodeCoord(int node, TPZVec<REAL> &nodeCoord)
    {
        if(node > NCornerNodes)
        {
            DebugStop();
        }
        nodeCoord.Resize(Dimension, 0.);
        switch (node) {
            case (0):
            {
                nodeCoord[0] = -1.;
                nodeCoord[1] = -1.;
                break;
            }
            case (1):
            {
                nodeCoord[0] =  1.;
                nodeCoord[1] = -1.;
                break;
            }
            case (2):
            {
                nodeCoord[0] = 1.;
                nodeCoord[1] = 1.;
                break;
            }
            case (3):
            {
                nodeCoord[0] = -1.;
                nodeCoord[1] =  1.;
                break;
            }
            default:
            {
                DebugStop();
                break;
            }
        }
    }